

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledevice.cpp
# Opt level: O1

void __thiscall QFileDevicePrivate::setError(QFileDevicePrivate *this,FileError err)

{
  QArrayData *data;
  
  this->error = err;
  if ((this->super_QIODevicePrivate).errorString.d.ptr != (char16_t *)0x0) {
    data = &((this->super_QIODevicePrivate).errorString.d.d)->super_QArrayData;
    (this->super_QIODevicePrivate).errorString.d.d = (Data *)0x0;
    (this->super_QIODevicePrivate).errorString.d.ptr = (char16_t *)0x0;
    (this->super_QIODevicePrivate).errorString.d.size = 0;
    if (data != (QArrayData *)0x0) {
      LOCK();
      (data->ref_)._q_value.super___atomic_base<int>._M_i =
           (data->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((data->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(data,2,0x10);
        return;
      }
    }
  }
  return;
}

Assistant:

void QFileDevicePrivate::setError(QFileDevice::FileError err)
{
    error = err;
    errorString.clear();
}